

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::Station(Station *this,Station *s)

{
  pointer ppVar1;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  Matrix *aux;
  int i;
  Collimator *in_stack_ffffffffffffff58;
  Collimator *in_stack_ffffffffffffff60;
  const_iterator in_stack_ffffffffffffff68;
  Matrix *this_00;
  pointer *__x;
  Matrix *m;
  Matrix *this_01;
  pointer *__k;
  pointer *this_02;
  int local_20;
  vector<double,_std::allocator<double>_> *__x_00;
  
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__Station_001a2be0;
  __x_00 = in_RDI;
  std::
  map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
  ::map((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
         *)0x14b3bc);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)0x14b3cf);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::
  pair<std::pair<int,_int>,_std::pair<int,_int>,_true>
            ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)in_stack_ffffffffffffff60);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x14b3f2);
  __k = &in_RDI[6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x14b408);
  in_RDI[7].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)(in_RSI + 0xb0);
  this_02 = &in_RDI[7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  maths::Matrix::Matrix((Matrix *)in_stack_ffffffffffffff60);
  this_00 = (Matrix *)
            &in_RDI[8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x14b44c);
  __x = &in_RDI[9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::map((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
         *)0x14b462);
  m = (Matrix *)
      &in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::map((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
         *)0x14b478);
  this_01 = (Matrix *)
            &in_RDI[0xd].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x14b48e)
  ;
  Collimator::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)
   &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(undefined4 *)(in_RSI + 0x40);
  *(undefined4 *)
   ((long)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = *(undefined4 *)(in_RSI + 0x44);
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = *(undefined4 *)(in_RSI + 0x48);
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = *(undefined4 *)(in_RSI + 0x4c);
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(undefined4 *)(in_RSI + 0x50);
  *(undefined4 *)
   ((long)&in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = *(undefined4 *)(in_RSI + 0x54);
  for (local_20 = 0;
      local_20 <
      *(int *)((long)&in_RDI[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_20 = local_20 + 1) {
    in_stack_ffffffffffffff68 =
         std::
         map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
         ::find((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                 *)in_stack_ffffffffffffff58,(key_type_conflict *)0x14b550);
    ppVar1 = std::_Rb_tree_const_iterator<std::pair<const_int,_const_maths::Matrix_*>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_int,_const_maths::Matrix_*>_> *)
                        0x14b56b);
    in_stack_ffffffffffffff58 = (Collimator *)ppVar1->second;
    in_stack_ffffffffffffff60 =
         (Collimator *)
         std::
         map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
         ::operator[]((map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                       *)this_02,(key_type_conflict *)__k);
    *(Collimator **)&(in_stack_ffffffffffffff60->beam_coord)._M_t._M_impl =
         in_stack_ffffffffffffff58;
  }
  maths::Matrix::Matrix(this_00,(Matrix *)in_stack_ffffffffffffff68._M_node);
  maths::Matrix::operator=(this_01,m);
  maths::Matrix::~Matrix(this_00);
  std::vector<double,_std::allocator<double>_>::operator=(unaff_retaddr,__x_00);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::operator=((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               *)unaff_retaddr,
              (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               *)__x_00);
  std::pair<std::pair<int,_int>,_std::pair<int,_int>_>::operator=
            ((pair<std::pair<int,_int>,_std::pair<int,_int>_> *)in_stack_ffffffffffffff60,
             (type)in_stack_ffffffffffffff58);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)m,
             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)__x);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::operator=((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               *)in_stack_ffffffffffffff60,
              (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               *)in_stack_ffffffffffffff58);
  std::
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::operator=((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               *)in_stack_ffffffffffffff60,
              (map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               *)in_stack_ffffffffffffff58);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_ffffffffffffff60,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_ffffffffffffff58);
  return;
}

Assistant:

Station::Station(const Station &s): collimator(s.collimator){
    collimator=s.collimator;
    angle=s.angle;
    max_apertures=s.max_apertures;
    max_intensity=s.max_intensity;
    min_intensity=s.min_intensity;
    initial_intensity=s.initial_intensity;
    step_intensity=s.step_intensity;
    n_volumes=s.n_volumes;
    for (int i=0; i<n_volumes; i++){
      const Matrix * aux= s.D.find(i)->second;
      D[i]=aux;
    }
    //I=s.I;
    I= Matrix (s.I);
    intensity=s.intensity;
    A=s.A;
    last_mem=s.last_mem;
    last_diff=s.last_diff;
    pos2beam=s.pos2beam;
    beam2pos=s.beam2pos;
    int2nb=s.int2nb;
  }